

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

bool __thiscall wallet::CWallet::ShouldResend(CWallet *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  time_point tVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->fBroadcastTransactions == true) {
    if (this->m_chain == (Chain *)0x0) {
      __assert_fail("m_chain",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                    ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
    }
    iVar3 = (*this->m_chain->_vptr_Chain[0x22])();
    if ((char)iVar3 != '\0') {
      tVar4 = NodeClock::now();
      bVar2 = (this->m_next_resend).__d.__r <= (long)tVar4.__d.__r;
      goto LAB_00531c01;
    }
  }
  bVar2 = false;
LAB_00531c01:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::ShouldResend() const
{
    // Don't attempt to resubmit if the wallet is configured to not broadcast
    if (!fBroadcastTransactions) return false;

    // During reindex, importing and IBD, old wallet transactions become
    // unconfirmed. Don't resend them as that would spam other nodes.
    // We only allow forcing mempool submission when not relaying to avoid this spam.
    if (!chain().isReadyToBroadcast()) return false;

    // Do this infrequently and randomly to avoid giving away
    // that these are our transactions.
    if (NodeClock::now() < m_next_resend) return false;

    return true;
}